

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

StringRefType *
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetSchemaErrorKeyword(SchemaErrorCode schemaErrorCode)

{
  int iVar1;
  StringRefType *pSVar2;
  
  switch(schemaErrorCode) {
  case kSchemaErrorStartUnknown:
    pSVar2 = GetStartUnknownString();
    return pSVar2;
  case kSchemaErrorRefPlainName:
    pSVar2 = GetRefPlainNameString();
    return pSVar2;
  case kSchemaErrorRefInvalid:
    pSVar2 = GetRefInvalidString();
    return pSVar2;
  case kSchemaErrorRefPointerInvalid:
    pSVar2 = GetRefPointerInvalidString();
    return pSVar2;
  case kSchemaErrorRefUnknown:
    pSVar2 = GetRefUnknownString();
    return pSVar2;
  case kSchemaErrorRefCyclical:
    pSVar2 = GetRefCyclicalString();
    return pSVar2;
  case kSchemaErrorRefNoRemoteProvider:
    pSVar2 = GetRefNoRemoteProviderString();
    return pSVar2;
  case kSchemaErrorRefNoRemoteSchema:
    pSVar2 = GetRefNoRemoteSchemaString();
    return pSVar2;
  case kSchemaErrorRegexInvalid:
    pSVar2 = GetRegexInvalidString();
    return pSVar2;
  case kSchemaErrorSpecUnknown:
    pSVar2 = GetSpecUnknownString();
    return pSVar2;
  case kSchemaErrorSpecUnsupported:
    pSVar2 = GetSpecUnsupportedString();
    return pSVar2;
  case kSchemaErrorSpecIllegal:
    pSVar2 = GetSpecIllegalString();
    return pSVar2;
  case kSchemaErrorReadOnlyAndWriteOnly:
    pSVar2 = GetReadOnlyAndWriteOnlyString();
    return pSVar2;
  }
  if ((GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
       ::GetNullString()::v == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                                   ::GetNullString()::v), iVar1 != 0)) {
    GetNullString::v.s = "null";
    GetNullString::v.length = 4;
    __cxa_guard_release(&GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                         ::GetNullString()::v);
  }
  return &GetNullString::v;
}

Assistant:

static const StringRefType& GetSchemaErrorKeyword(SchemaErrorCode schemaErrorCode) {
        switch (schemaErrorCode) {
            case kSchemaErrorStartUnknown:             return GetStartUnknownString();
            case kSchemaErrorRefPlainName:             return GetRefPlainNameString();
            case kSchemaErrorRefInvalid:               return GetRefInvalidString();
            case kSchemaErrorRefPointerInvalid:        return GetRefPointerInvalidString();
            case kSchemaErrorRefUnknown:               return GetRefUnknownString();
            case kSchemaErrorRefCyclical:              return GetRefCyclicalString();
            case kSchemaErrorRefNoRemoteProvider:      return GetRefNoRemoteProviderString();
            case kSchemaErrorRefNoRemoteSchema:        return GetRefNoRemoteSchemaString();
            case kSchemaErrorRegexInvalid:             return GetRegexInvalidString();
            case kSchemaErrorSpecUnknown:              return GetSpecUnknownString();
            case kSchemaErrorSpecUnsupported:          return GetSpecUnsupportedString();
            case kSchemaErrorSpecIllegal:              return GetSpecIllegalString();
            case kSchemaErrorReadOnlyAndWriteOnly:     return GetReadOnlyAndWriteOnlyString();
            default:                                   return GetNullString();
        }
    }